

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::Name> * __thiscall
wasm::WATParser::Lexer::takeID(optional<wasm::Name> *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  LexIdResult *pLVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  LexIdResult *this_00;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> str_00;
  string_view in;
  Name local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  Name local_a0;
  int local_8c;
  Name local_88 [2];
  string_view local_68;
  undefined1 local_58 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> result;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
  _M_payload.
  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._64_8_ = this;
  local_68 = next(this);
  in._M_str = in_RCX;
  in._M_len = (size_t)local_68._M_str;
  anon_unknown_0::ident
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_58,
             (anon_unknown_0 *)local_68._M_len,in);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_58);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2);
    this->pos = this->pos + sVar3;
    advance(this);
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_58);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&pLVar2->str);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_58)
      ;
      str = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&pLVar2->str);
      wasm::Name::Name(local_88,str);
      std::optional<wasm::Name>::optional<wasm::Name,_true>(__return_storage_ptr__,local_88);
      local_8c = 1;
    }
    else {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_58)
      ;
      if ((pLVar2->isStr & 1U) == 0) {
        pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
                            local_58);
        str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2,1,
                            0xffffffffffffffff);
        wasm::Name::Name(&local_c0,str_00);
        std::optional<wasm::Name>::optional<wasm::Name,_true>(__return_storage_ptr__,&local_c0);
        local_8c = 1;
      }
      else {
        pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
                            local_58);
        this_00 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::operator->
                            ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
                             local_58);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
        local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2,2,sVar3 - 3
                             );
        wasm::Name::Name(&local_a0,local_b0);
        std::optional<wasm::Name>::optional<wasm::Name,_true>(__return_storage_ptr__,&local_a0);
        local_8c = 1;
      }
    }
  }
  else {
    local_8c = 0;
  }
  std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::~optional
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_58);
  if (local_8c == 0) {
    std::optional<wasm::Name>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Name> Lexer::takeID() {
  if (auto result = ident(next())) {
    pos += result->span.size();
    advance();
    if (result->str) {
      return Name(*result->str);
    }
    if (result->isStr) {
      // Remove '$' and quotes.
      return Name(result->span.substr(2, result->span.size() - 3));
    }
    // Remove '$'.
    return Name(result->span.substr(1));
  }
  return std::nullopt;
}